

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall
QTreeViewPrivate::prepareAnimatedOperation(QTreeViewPrivate *this,int item,Direction direction)

{
  AnimatedOperation *pAVar1;
  uint uVar2;
  QWidgetData *pQVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long in_FS_OFFSET;
  undefined1 local_80 [40];
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar1 = &this->animatedOperation;
  (this->animatedOperation).item = item;
  (this->animatedOperation).viewport =
       (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
  QAbstractAnimation::setDirection((Direction)pAVar1);
  iVar5 = coordinateForItem(this,item);
  iVar6 = itemHeight(this,item);
  pQVar3 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->data;
  local_80._32_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
  iVar8 = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
  uVar9 = iVar6 + iVar5;
  local_80._36_4_ = iVar8;
  local_80._24_8_ = (ulong)uVar9 << 0x20;
  if (direction == Backward) {
    uVar2 = *(uint *)&(this->viewItems).d.ptr[item].field_0x1c;
    iVar5 = 0;
    if ((0xf < uVar2) && (iVar6 = (iVar8 - uVar9) * 2 + 2, 0 < iVar6)) {
      iVar8 = item + 1;
      iVar5 = 0;
      do {
        iVar7 = itemHeight(this,iVar8);
        iVar5 = iVar7 + iVar5;
        if ((int)((uVar2 >> 4) + item) <= iVar8) break;
        iVar8 = iVar8 + 1;
      } while (iVar5 < iVar6);
    }
    local_80._36_4_ = iVar5 + uVar9 + -1;
    ::QVariant::QVariant(&local_58,iVar5 + uVar9);
    QVariantAnimation::setEndValue((QVariant *)pAVar1);
    ::QVariant::~QVariant(&local_58);
  }
  ::QVariant::QVariant(&local_58,uVar9);
  QVariantAnimation::setStartValue((QVariant *)pAVar1);
  ::QVariant::~QVariant(&local_58);
  renderTreeToPixmapForAnimation((QTreeViewPrivate *)local_80,(QRect *)this);
  local_58.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
  uVar4 = local_80._16_8_;
  local_58.d.data.shared = (PrivateShared *)QDataStream::operator<<;
  local_80._16_8_ = 0;
  local_58.d.data._16_8_ = *(undefined8 *)&(this->animatedOperation).field_0x28;
  *(undefined8 *)&(this->animatedOperation).field_0x28 = uVar4;
  QPixmap::~QPixmap((QPixmap *)&local_58);
  QPixmap::~QPixmap((QPixmap *)local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::prepareAnimatedOperation(int item, QVariantAnimation::Direction direction)
{
    animatedOperation.item = item;
    animatedOperation.viewport = viewport;
    animatedOperation.setDirection(direction);

    int top = coordinateForItem(item) + itemHeight(item);
    QRect rect = viewport->rect();
    rect.setTop(top);
    if (direction == QVariantAnimation::Backward) {
        const int limit = rect.height() * 2;
        int h = 0;
        int c = item + viewItems.at(item).total + 1;
        for (int i = item + 1; i < c && h < limit; ++i)
            h += itemHeight(i);
        rect.setHeight(h);
        animatedOperation.setEndValue(top + h);
    }
    animatedOperation.setStartValue(top);
    animatedOperation.before = renderTreeToPixmapForAnimation(rect);
}